

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estring.cpp
# Opt level: O2

string * embree::toUpperCase(string *__return_storage_ptr__,string *s)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
            (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(__first._M_current + __return_storage_ptr__->_M_string_length),__first,
             to_upper);
  return __return_storage_ptr__;
}

Assistant:

std::string toUpperCase(const std::string& s) { std::string dst(s); std::transform(dst.begin(), dst.end(), dst.begin(), to_upper); return dst; }